

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O0

void __thiscall HighsLpRelaxation::Playground::~Playground(Playground *this)

{
  undefined8 *in_RDI;
  Highs *in_stack_00000058;
  undefined1 in_stack_00005827;
  HighsLpRelaxation *in_stack_00005828;
  
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    getLpSolver((HighsLpRelaxation *)*in_RDI);
    Highs::getIterate(in_stack_00000058);
    run(in_stack_00005828,(bool)in_stack_00005827);
  }
  return;
}

Assistant:

~Playground() {
      if (iterateStored) {
        lp->getLpSolver().getIterate();
        lp->run();
        // If desired, here is the place to clear the stored iterate
      }
    }